

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O0

bool __thiscall Js::RecyclableObject::HasAnySpecialProperties(RecyclableObject *this)

{
  bool bVar1;
  TypeId typeId;
  DynamicObject *this_00;
  DynamicTypeHandler *this_01;
  ArrayObject *this_02;
  CustomExternalWrapperObject *this_03;
  byte local_2a;
  byte local_29;
  DynamicObject *obj;
  RecyclableObject *this_local;
  
  typeId = GetTypeId(this);
  bVar1 = DynamicType::Is(typeId);
  if (!bVar1) {
    return true;
  }
  this_00 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(this);
  this_01 = DynamicObject::GetTypeHandler(this_00);
  bVar1 = DynamicTypeHandler::GetHasSpecialProperties(this_01);
  local_29 = 1;
  if (!bVar1) {
    bVar1 = DynamicObject::HasObjectArray(this_00);
    if (bVar1) {
      this_02 = DynamicObject::GetObjectArrayOrFlagsAsArray(this_00);
      bVar1 = HasAnySpecialProperties((RecyclableObject *)this_02);
      local_29 = 1;
      if (bVar1) goto LAB_014356e2;
    }
    bVar1 = VarIs<Js::CustomExternalWrapperObject,Js::DynamicObject>(this_00);
    local_2a = 0;
    if (bVar1) {
      this_03 = UnsafeVarTo<Js::CustomExternalWrapperObject,Js::DynamicObject>(this_00);
      bVar1 = Js::CustomExternalWrapperObject::IsInitialized(this_03);
      local_2a = bVar1 ^ 0xff;
    }
    local_29 = local_2a;
  }
LAB_014356e2:
  return (bool)(local_29 & 1);
}

Assistant:

bool RecyclableObject::HasAnySpecialProperties()
    {
        if (DynamicType::Is(this->GetTypeId()))
        {
            DynamicObject* obj = UnsafeVarTo<DynamicObject>(this);
            return obj->GetTypeHandler()->GetHasSpecialProperties() ||
                (obj->HasObjectArray() && obj->GetObjectArrayOrFlagsAsArray()->HasAnySpecialProperties())
#ifdef _CHAKRACOREBUILD
                || (VarIs<CustomExternalWrapperObject>(obj) && !UnsafeVarTo<CustomExternalWrapperObject>(obj)->IsInitialized())
#endif
                ;
        }

        return true;
    }